

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void Eigen::internal::manage_caching_sizes(Action action,ptrdiff_t *l1,ptrdiff_t *l2,ptrdiff_t *l3)

{
  int iVar1;
  CacheSizes *in_RCX;
  ptrdiff_t *in_RDX;
  ptrdiff_t *in_RSI;
  int in_EDI;
  
  if ((manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes == '\0') &&
     (iVar1 = __cxa_guard_acquire(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::
                                   m_cacheSizes), iVar1 != 0)) {
    CacheSizes::CacheSizes(in_RCX);
    __cxa_guard_release(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes);
  }
  if (in_EDI == 1) {
    manage_caching_sizes::m_cacheSizes.m_l1 = *in_RSI;
    manage_caching_sizes::m_cacheSizes.m_l2 = *in_RDX;
    manage_caching_sizes::m_cacheSizes.m_l3 = in_RCX->m_l1;
  }
  else if (in_EDI == 0) {
    *in_RSI = manage_caching_sizes::m_cacheSizes.m_l1;
    *in_RDX = manage_caching_sizes::m_cacheSizes.m_l2;
    in_RCX->m_l1 = manage_caching_sizes::m_cacheSizes.m_l3;
  }
  return;
}

Assistant:

inline void manage_caching_sizes(Action action, std::ptrdiff_t* l1, std::ptrdiff_t* l2, std::ptrdiff_t* l3)
{
  static CacheSizes m_cacheSizes;

  if(action==SetAction)
  {
    // set the cpu cache size and cache all block sizes from a global cache size in byte
    eigen_internal_assert(l1!=0 && l2!=0);
    m_cacheSizes.m_l1 = *l1;
    m_cacheSizes.m_l2 = *l2;
    m_cacheSizes.m_l3 = *l3;
  }
  else if(action==GetAction)
  {
    eigen_internal_assert(l1!=0 && l2!=0);
    *l1 = m_cacheSizes.m_l1;
    *l2 = m_cacheSizes.m_l2;
    *l3 = m_cacheSizes.m_l3;
  }
  else
  {
    eigen_internal_assert(false);
  }
}